

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint uVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  
  IVar9.x = (float)(int)((this->WindowPadding).x * scale_factor);
  IVar9.y = (float)(int)((this->WindowPadding).y * scale_factor);
  this->WindowPadding = IVar9;
  this->WindowRounding = (float)(int)(this->WindowRounding * scale_factor);
  IVar10.x = (float)(int)((this->WindowMinSize).x * scale_factor);
  IVar10.y = (float)(int)((this->WindowMinSize).y * scale_factor);
  this->WindowMinSize = IVar10;
  this->ChildRounding = (float)(int)(this->ChildRounding * scale_factor);
  this->PopupRounding = (float)(int)(this->PopupRounding * scale_factor);
  IVar2.y = (float)(int)((this->FramePadding).y * scale_factor);
  IVar2.x = (float)(int)((this->FramePadding).x * scale_factor);
  this->FramePadding = IVar2;
  this->FrameRounding = (float)(int)(this->FrameRounding * scale_factor);
  IVar5.x = (float)(int)((this->ItemSpacing).x * scale_factor);
  IVar5.y = (float)(int)((this->ItemSpacing).y * scale_factor);
  IVar3.y = (float)(int)((this->ItemInnerSpacing).y * scale_factor);
  IVar3.x = (float)(int)((this->ItemInnerSpacing).x * scale_factor);
  this->ItemSpacing = IVar5;
  this->ItemInnerSpacing = IVar3;
  IVar6.x = (float)(int)((this->CellPadding).x * scale_factor);
  IVar6.y = (float)(int)((this->CellPadding).y * scale_factor);
  this->CellPadding = IVar6;
  IVar7.x = (float)(int)((this->TouchExtraPadding).x * scale_factor);
  IVar7.y = (float)(int)((this->TouchExtraPadding).y * scale_factor);
  this->TouchExtraPadding = IVar7;
  this->IndentSpacing = (float)(int)(this->IndentSpacing * scale_factor);
  this->ColumnsMinSpacing = (float)(int)(this->ColumnsMinSpacing * scale_factor);
  this->ScrollbarSize = (float)(int)(this->ScrollbarSize * scale_factor);
  this->ScrollbarRounding = (float)(int)(this->ScrollbarRounding * scale_factor);
  this->GrabMinSize = (float)(int)(this->GrabMinSize * scale_factor);
  this->GrabRounding = (float)(int)(this->GrabRounding * scale_factor);
  this->LogSliderDeadzone = (float)(int)(this->LogSliderDeadzone * scale_factor);
  this->TabRounding = (float)(int)(this->TabRounding * scale_factor);
  uVar4 = -(uint)(this->TabMinWidthForCloseButton != 3.4028235e+38);
  this->TabMinWidthForCloseButton =
       (float)(~uVar4 & 0x7f7fffff |
              (uint)(float)(int)(this->TabMinWidthForCloseButton * scale_factor) & uVar4);
  IVar8.x = (float)(int)((this->DisplayWindowPadding).x * scale_factor);
  IVar8.y = (float)(int)((this->DisplayWindowPadding).y * scale_factor);
  this->DisplayWindowPadding = IVar8;
  IVar1.y = (float)(int)((this->DisplaySafeAreaPadding).y * scale_factor);
  IVar1.x = (float)(int)((this->DisplaySafeAreaPadding).x * scale_factor);
  this->DisplaySafeAreaPadding = IVar1;
  this->MouseCursorScale = (float)(int)(scale_factor * this->MouseCursorScale);
  return;
}

Assistant:

IM_MSVC_RUNTIME_CHECKS_OFF
static inline ImVec2 operator*(const ImVec2& lhs, const float rhs)              { return ImVec2(lhs.x * rhs, lhs.y * rhs); }